

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Token * __thiscall
toml::internal::Lexer::nextStringSingleQuote(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  string s;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  cVar1 = std::istream::peek();
  if (cVar1 == '\'') {
    iVar2 = std::istream::get();
    if (iVar2 == 10) {
      this->lineNo_ = this->lineNo_ + 1;
    }
    local_40 = 0;
    local_38 = 0;
    local_48 = &local_38;
    uVar3 = std::istream::peek();
    if ((char)uVar3 == '\'') {
      iVar2 = std::istream::get();
      if (iVar2 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      uVar4 = std::istream::peek();
      uVar3 = uVar3 & 0xff;
      if (uVar4 != 0xffffffff) {
        uVar3 = uVar4;
      }
      if (uVar4 != 0xffffffff && (char)uVar3 == '\'') {
        iVar2 = std::istream::get();
        if (iVar2 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        iVar2 = std::istream::peek();
        if (((iVar2 != -1) && ((char)iVar2 == '\n')) && (iVar2 = std::istream::get(), iVar2 == 10))
        {
          this->lineNo_ = this->lineNo_ + 1;
        }
LAB_00134ef4:
        while (iVar2 = std::istream::peek(), iVar2 != -1) {
          cVar1 = (char)&local_48;
          if ((char)iVar2 == '\'') {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            iVar2 = std::istream::peek();
            if ((iVar2 != -1) && ((char)iVar2 == '\'')) {
              iVar2 = std::istream::get();
              if (iVar2 == 10) {
                this->lineNo_ = this->lineNo_ + 1;
              }
              iVar2 = std::istream::peek();
              if ((iVar2 == -1) || ((char)iVar2 != '\'')) goto LAB_00134f6c;
              iVar2 = std::istream::get();
              if (iVar2 == 10) {
                this->lineNo_ = this->lineNo_ + 1;
              }
              __return_storage_ptr__->type_ = MULTILINE_STRING;
              (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->str_value_).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->str_value_,local_48,local_48 + local_40)
              ;
LAB_00135111:
              (__return_storage_ptr__->time_value_).__d.__r = 0;
              goto LAB_0013517b;
            }
            std::__cxx11::string::push_back(cVar1);
          }
          else {
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            std::__cxx11::string::push_back(cVar1);
          }
        }
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"string didn\'t end with \'\'\'\'\' ?","");
        __return_storage_ptr__->type_ = ERROR_TOKEN;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_68,local_68 + local_60);
      }
      else {
        local_68 = &local_58;
        local_60 = 0;
        local_58 = 0;
        __return_storage_ptr__->type_ = STRING;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_68,local_68);
      }
    }
    else {
      while (iVar2 = std::istream::peek(), iVar2 != -1) {
        iVar5 = std::istream::get();
        if (iVar5 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        if ((char)iVar2 == '\'') {
          __return_storage_ptr__->type_ = STRING;
          (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->str_value_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->str_value_,local_48,local_48 + local_40);
          goto LAB_00135111;
        }
        std::__cxx11::string::push_back((char)&local_48);
      }
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"string didn\'t end with \'\'\'?","");
      __return_storage_ptr__->type_ = ERROR_TOKEN;
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->str_value_,local_68,local_68 + local_60);
    }
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
LAB_0013517b:
    if (local_48 == &local_38) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"string didn\'t start with \'\'\'?","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_48,local_48 + local_40);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if (local_48 == &local_38) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  return __return_storage_ptr__;
LAB_00134f6c:
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::push_back(cVar1);
  goto LAB_00134ef4;
}

Assistant:

inline Token Lexer::nextStringSingleQuote()
{
    if (!consume('\''))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\''?"));

    std::string s;
    char c;

    if (current(&c) && c == '\'') {
        next();
        if (!current(&c) || c != '\'') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }
        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        if (current(&c) && c == '\n')
            next();

        while (current(&c)) {
            if (c == '\'') {
                next();
                if (current(&c) && c == '\'') {
                    next();
                    if (current(&c) && c == '\'') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '\'';
                        s += '\'';
                        continue;
                    }
                } else {
                    s += '\'';
                    continue;
                }
            }

            next();
            s += c;
            continue;
        }

        return Token(TokenType::ERROR_TOKEN, std::string("string didn't end with '\'\'\'' ?"));
    }

    while (current(&c)) {
        next();
        if (c == '\'') {
            return Token(TokenType::STRING, s);
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end with '\''?"));
}